

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

iterator * cs_impl::array_cs_ext::next(iterator *it)

{
  _Elt_pointer paVar1;
  _Map_pointer ppaVar2;
  any *paVar3;
  _Elt_pointer paVar4;
  iterator *in_RDI;
  
  paVar4 = it->_M_cur;
  in_RDI->_M_cur = paVar4;
  in_RDI->_M_first = it->_M_first;
  paVar1 = it->_M_last;
  in_RDI->_M_last = paVar1;
  ppaVar2 = it->_M_node;
  in_RDI->_M_node = ppaVar2;
  paVar4 = paVar4 + 1;
  it->_M_cur = paVar4;
  if (paVar4 != paVar1) {
    return in_RDI;
  }
  it->_M_node = ppaVar2 + 1;
  paVar3 = ppaVar2[1];
  it->_M_first = paVar3;
  it->_M_last = paVar3 + 0x40;
  it->_M_cur = paVar3;
  return in_RDI;
}

Assistant:

array::iterator next(array::iterator &it)
		{
			return it++;
		}